

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m512 x;
  __m512 y;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [32];
  undefined1 auVar79 [16];
  int iVar78;
  int in_ECX;
  undefined1 (*in_RDX) [64];
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar81 [64];
  float fVar82;
  float fVar83;
  undefined8 uVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined8 uVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined8 uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2650;
  undefined8 uStackY_2648;
  undefined8 local_2620;
  undefined8 uStackY_2618;
  undefined8 uStackY_2610;
  undefined8 uStackY_2608;
  int local_24f4;
  undefined1 (*local_24e0) [64];
  undefined1 (*local_24d0) [32];
  undefined8 in_stack_ffffffffffffdbf8;
  undefined8 in_stack_ffffffffffffdc00;
  undefined8 in_stack_ffffffffffffdc08;
  undefined8 in_stack_ffffffffffffdc10;
  undefined8 in_stack_ffffffffffffdc18;
  undefined4 in_stack_ffffffffffffdc20;
  undefined4 in_stack_ffffffffffffdc24;
  undefined4 in_stack_ffffffffffffdc28;
  undefined4 in_stack_ffffffffffffdc2c;
  undefined8 in_stack_ffffffffffffdc30;
  undefined4 in_stack_ffffffffffffdc38;
  undefined4 in_stack_ffffffffffffdc3c;
  undefined1 auVar104 [56];
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  
  iVar78 = in_ECX * in_R8D;
  local_24f4 = 0;
  auVar81 = vbroadcastss_avx512f(ZEXT416(*in_RSI));
  auVar104 = auVar81._0_56_;
  local_24e0 = in_RDX;
  local_24d0 = in_RDI;
  for (; local_24f4 + 0xf < iVar78; local_24f4 = local_24f4 + 0x10) {
    uVar84 = *(undefined8 *)*local_24d0;
    uVar89 = *(undefined8 *)(*local_24d0 + 8);
    uVar94 = *(undefined8 *)(*local_24d0 + 0x10);
    uVar99 = *(undefined8 *)(*local_24d0 + 0x18);
    uVar100 = *(undefined8 *)local_24d0[1];
    uVar101 = *(undefined8 *)(local_24d0[1] + 8);
    uVar102 = *(undefined8 *)(local_24d0[1] + 0x10);
    uVar103 = *(undefined8 *)(local_24d0[1] + 0x18);
    y[1] = (float)in_stack_ffffffffffffdc3c;
    y[0] = (float)in_stack_ffffffffffffdc38;
    y[2] = (float)auVar104._0_4_;
    y[3] = (float)auVar104._4_4_;
    y[4] = (float)auVar104._8_4_;
    y[5] = (float)auVar104._12_4_;
    y[6] = (float)auVar104._16_4_;
    y[7] = (float)auVar104._20_4_;
    y[8] = (float)auVar104._24_4_;
    y[9] = (float)auVar104._28_4_;
    y[10] = (float)auVar104._32_4_;
    y[0xb] = (float)auVar104._36_4_;
    y[0xc] = (float)auVar104._40_4_;
    y[0xd] = (float)auVar104._44_4_;
    y[0xe] = (float)auVar104._48_4_;
    y[0xf] = (float)auVar104._52_4_;
    x[2] = (float)(int)in_stack_ffffffffffffdc00;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffdc00 >> 0x20);
    x[0] = (float)(int)in_stack_ffffffffffffdbf8;
    x[1] = (float)(int)((ulong)in_stack_ffffffffffffdbf8 >> 0x20);
    x[4] = (float)(int)in_stack_ffffffffffffdc08;
    x[5] = (float)(int)((ulong)in_stack_ffffffffffffdc08 >> 0x20);
    x[6] = (float)(int)in_stack_ffffffffffffdc10;
    x[7] = (float)(int)((ulong)in_stack_ffffffffffffdc10 >> 0x20);
    x[8] = (float)(int)in_stack_ffffffffffffdc18;
    x[9] = (float)(int)((ulong)in_stack_ffffffffffffdc18 >> 0x20);
    x[10] = (float)in_stack_ffffffffffffdc20;
    x[0xb] = (float)in_stack_ffffffffffffdc24;
    x[0xc] = (float)in_stack_ffffffffffffdc28;
    x[0xd] = (float)in_stack_ffffffffffffdc2c;
    x[0xe] = (float)(int)in_stack_ffffffffffffdc30;
    x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdc30 >> 0x20);
    atan2512_ps(y,x);
    auVar81._8_8_ = uVar89;
    auVar81._0_8_ = uVar84;
    auVar81._16_8_ = uVar94;
    auVar81._24_8_ = uVar99;
    auVar81._32_8_ = uVar100;
    auVar81._40_8_ = uVar101;
    auVar81._48_8_ = uVar102;
    auVar81._56_8_ = uVar103;
    *local_24e0 = auVar81;
    local_24d0 = local_24d0 + 2;
    local_24e0 = local_24e0 + 1;
  }
  uVar1 = *in_RSI;
  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
  uStack_2350 = auVar4._0_8_;
  uStack_2348 = auVar4._8_8_;
  for (; local_24f4 + 7 < iVar78; local_24f4 = local_24f4 + 8) {
    auVar43._16_8_ = uStack_2350;
    auVar43._0_16_ = auVar5;
    auVar43._24_8_ = uStack_2348;
    auVar42._16_8_ = uStack_2350;
    auVar42._0_16_ = auVar5;
    auVar42._24_8_ = uStack_2348;
    auVar41._16_8_ = uStack_2350;
    auVar41._0_16_ = auVar5;
    auVar41._24_8_ = uStack_2348;
    auVar21._16_8_ = uStack_2350;
    auVar21._0_16_ = auVar5;
    auVar21._24_8_ = uStack_2348;
    auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
    auVar79 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0),0x20);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0),0x30);
    uStack_2070 = auVar79._0_8_;
    uStack_2068 = auVar79._8_8_;
    auVar79 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0x80000000),0x20);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0x80000000),0x30);
    auVar6 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x80000000),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x80000000),0x30);
    uStack_2030 = auVar6._0_8_;
    uStack_2028 = auVar6._8_8_;
    auVar6 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40490fdb),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40490fdb),0x30);
    auVar7 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40490fdb),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40490fdb),0x30);
    uStack_1ff0 = auVar7._0_8_;
    uStack_1fe8 = auVar7._8_8_;
    auVar7 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3fc90fdb),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3fc90fdb),0x30);
    auVar8 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3fc90fdb),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3fc90fdb),0x30);
    uStack_1fb0 = auVar8._0_8_;
    uStack_1fa8 = auVar8._8_8_;
    auVar2._16_8_ = uStack_2070;
    auVar2._0_16_ = auVar4;
    auVar2._24_8_ = uStack_2068;
    auVar2 = vcmpps_avx(auVar21,auVar2,4);
    auVar3._16_8_ = uStack_2070;
    auVar3._0_16_ = auVar4;
    auVar3._24_8_ = uStack_2068;
    auVar3 = vcmpps_avx(*local_24d0,auVar3,4);
    auVar21 = vpand_avx2(auVar2,auVar3);
    auVar27._16_8_ = uStack_2030;
    auVar27._0_16_ = auVar79;
    auVar27._24_8_ = uStack_2028;
    auVar22 = vpand_avx2(auVar27,auVar41);
    auVar26._16_8_ = uStack_2030;
    auVar26._0_16_ = auVar79;
    auVar26._24_8_ = uStack_2028;
    auVar23 = vpand_avx2(auVar26,*local_24d0);
    auVar80._16_8_ = uStack_2070;
    auVar80._0_16_ = auVar4;
    auVar80._24_8_ = uStack_2068;
    auVar2 = vcmpps_avx(auVar42,auVar80,1);
    auVar80 = vcmpps_avx(*local_24d0,auVar80,1);
    auVar25._16_8_ = uStack_2030;
    auVar25._0_16_ = auVar79;
    auVar25._24_8_ = uStack_2028;
    auVar80 = vpand_avx2(auVar80,auVar25);
    auVar30._16_8_ = uStack_1ff0;
    auVar30._0_16_ = auVar6;
    auVar30._24_8_ = uStack_1fe8;
    auVar80 = vpor_avx2(auVar80,auVar30);
    auVar24 = vpand_avx2(auVar2,auVar80);
    auVar2 = vdivps_avx(*local_24d0,auVar43);
    auVar79 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0x80000000),0x20);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(0x80000000),0x30);
    auVar8 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x80000000),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x80000000),0x30);
    uStack_17b0 = auVar8._0_8_;
    uStack_17a8 = auVar8._8_8_;
    auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
    auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
    uStack_1770 = auVar9._0_8_;
    uStack_1768 = auVar9._8_8_;
    auVar9 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbf800000),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbf800000),0x30);
    auVar10 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbf800000),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbf800000),0x30);
    uStack_1730 = auVar10._0_8_;
    uStack_1728 = auVar10._8_8_;
    auVar10 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3fc90fdb),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3fc90fdb),0x30);
    auVar11 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3fc90fdb),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3fc90fdb),0x30);
    uStack_16f0 = auVar11._0_8_;
    uStack_16e8 = auVar11._8_8_;
    auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
    auVar12 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x30);
    uStack_16b0 = auVar12._0_8_;
    uStack_16a8 = auVar12._8_8_;
    auVar12 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0xbeaaaa53),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0xbeaaaa53),0x30);
    auVar13 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0xbeaaaa53),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0xbeaaaa53),0x30);
    uStack_1670 = auVar13._0_8_;
    uStack_1668 = auVar13._8_8_;
    auVar13 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3e4cb974),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3e4cb974),0x30);
    auVar14 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3e4cb974),0x20);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3e4cb974),0x30);
    uStack_1630 = auVar14._0_8_;
    uStack_1628 = auVar14._8_8_;
    auVar14 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0xbe117200),0x20);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0xbe117200),0x30);
    auVar15 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0xbe117200),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0xbe117200),0x30);
    uStack_15f0 = auVar15._0_8_;
    uStack_15e8 = auVar15._8_8_;
    auVar15 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3dd9ed24),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3dd9ed24),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3dd9ed24),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3dd9ed24),0x30);
    uStack_15b0 = auVar16._0_8_;
    uStack_15a8 = auVar16._8_8_;
    auVar16 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0xbd99b01e),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0xbd99b01e),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0xbd99b01e),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0xbd99b01e),0x30);
    uStack_1570 = auVar17._0_8_;
    uStack_1568 = auVar17._8_8_;
    auVar17 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3d2edd4e),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3d2edd4e),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3d2edd4e),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3d2edd4e),0x30);
    uStack_1530 = auVar18._0_8_;
    uStack_1528 = auVar18._8_8_;
    auVar18 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbc83a25c),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbc83a25c),0x30);
    auVar19 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbc83a25c),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbc83a25c),0x30);
    uStack_14f0 = auVar19._0_8_;
    uStack_14e8 = auVar19._8_8_;
    auVar19 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3b3ac537),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3b3ac537),0x30);
    auVar20 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3b3ac537),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3b3ac537),0x30);
    uStack_14b0 = auVar20._0_8_;
    uStack_14a8 = auVar20._8_8_;
    auVar34._16_8_ = uStack_17b0;
    auVar34._0_16_ = auVar79;
    auVar34._24_8_ = uStack_17a8;
    auVar25 = vpand_avx2(auVar34,auVar2);
    auVar37._16_8_ = uStack_17b0;
    auVar37._0_16_ = auVar79;
    auVar37._24_8_ = uStack_17a8;
    auVar26 = vpandn_avx2(auVar37,auVar2);
    auVar31._16_8_ = uStack_1770;
    auVar31._0_16_ = auVar8;
    auVar31._24_8_ = uStack_1768;
    auVar2 = vcmpps_avx(auVar31,auVar26,1);
    auVar33._16_8_ = uStack_1730;
    auVar33._0_16_ = auVar9;
    auVar33._24_8_ = uStack_1728;
    auVar80 = vpand_avx2(auVar2,auVar33);
    auVar27 = vpandn_avx2(auVar2,auVar26);
    auVar27 = vpor_avx2(auVar80,auVar27);
    auVar80 = vpand_avx2(auVar2,auVar26);
    auVar36._16_8_ = uStack_1770;
    auVar36._0_16_ = auVar8;
    auVar36._24_8_ = uStack_1768;
    auVar26 = vpandn_avx2(auVar2,auVar36);
    auVar80 = vpor_avx2(auVar80,auVar26);
    auVar80 = vdivps_avx(auVar27,auVar80);
    local_13e0 = auVar80._0_4_;
    fStack_13dc = auVar80._4_4_;
    fStack_13d8 = auVar80._8_4_;
    fStack_13d4 = auVar80._12_4_;
    fStack_13d0 = auVar80._16_4_;
    fStack_13cc = auVar80._20_4_;
    fStack_13c8 = auVar80._24_4_;
    fStack_13c4 = auVar80._28_4_;
    fVar82 = local_13e0 * local_13e0;
    fVar85 = fStack_13dc * fStack_13dc;
    fVar87 = fStack_13d8 * fStack_13d8;
    fVar90 = fStack_13d4 * fStack_13d4;
    fVar92 = fStack_13d0 * fStack_13d0;
    fVar95 = fStack_13cc * fStack_13cc;
    fVar97 = fStack_13c8 * fStack_13c8;
    fVar83 = fVar82 * fVar82;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar91 = fVar90 * fVar90;
    fVar93 = fVar92 * fVar92;
    fVar96 = fVar95 * fVar95;
    fVar98 = fVar97 * fVar97;
    auVar44._4_4_ = fVar86;
    auVar44._0_4_ = fVar83;
    auVar44._8_4_ = fVar88;
    auVar44._12_4_ = fVar91;
    auVar44._16_4_ = fVar93;
    auVar44._20_4_ = fVar96;
    auVar44._24_4_ = fVar98;
    auVar44._28_4_ = fStack_13c4;
    auVar53._16_8_ = uStack_14f0;
    auVar53._0_16_ = auVar18;
    auVar53._24_8_ = uStack_14e8;
    auVar55._16_8_ = uStack_1570;
    auVar55._0_16_ = auVar16;
    auVar55._24_8_ = uStack_1568;
    auVar79 = vfmadd213ps_fma(auVar53,auVar44,auVar55);
    auVar45._4_4_ = fVar86;
    auVar45._0_4_ = fVar83;
    auVar45._8_4_ = fVar88;
    auVar45._12_4_ = fVar91;
    auVar45._16_4_ = fVar93;
    auVar45._20_4_ = fVar96;
    auVar45._24_4_ = fVar98;
    auVar45._28_4_ = fStack_13c4;
    auVar57._16_8_ = uStack_15f0;
    auVar57._0_16_ = auVar14;
    auVar57._24_8_ = uStack_15e8;
    auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar45,auVar57);
    auVar46._4_4_ = fVar86;
    auVar46._0_4_ = fVar83;
    auVar46._8_4_ = fVar88;
    auVar46._12_4_ = fVar91;
    auVar46._16_4_ = fVar93;
    auVar46._20_4_ = fVar96;
    auVar46._24_4_ = fVar98;
    auVar46._28_4_ = fStack_13c4;
    auVar59._16_8_ = uStack_1670;
    auVar59._0_16_ = auVar12;
    auVar59._24_8_ = uStack_1668;
    auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar46,auVar59);
    auVar47._4_4_ = fVar86;
    auVar47._0_4_ = fVar83;
    auVar47._8_4_ = fVar88;
    auVar47._12_4_ = fVar91;
    auVar47._16_4_ = fVar93;
    auVar47._20_4_ = fVar96;
    auVar47._24_4_ = fVar98;
    auVar47._28_4_ = fStack_13c4;
    auVar52._16_8_ = uStack_14b0;
    auVar52._0_16_ = auVar19;
    auVar52._24_8_ = uStack_14a8;
    auVar54._16_8_ = uStack_1530;
    auVar54._0_16_ = auVar17;
    auVar54._24_8_ = uStack_1528;
    auVar8 = vfmadd213ps_fma(auVar52,auVar47,auVar54);
    auVar48._4_4_ = fVar86;
    auVar48._0_4_ = fVar83;
    auVar48._8_4_ = fVar88;
    auVar48._12_4_ = fVar91;
    auVar48._16_4_ = fVar93;
    auVar48._20_4_ = fVar96;
    auVar48._24_4_ = fVar98;
    auVar48._28_4_ = fStack_13c4;
    auVar56._16_8_ = uStack_15b0;
    auVar56._0_16_ = auVar15;
    auVar56._24_8_ = uStack_15a8;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar48,auVar56);
    auVar49._4_4_ = fVar86;
    auVar49._0_4_ = fVar83;
    auVar49._8_4_ = fVar88;
    auVar49._12_4_ = fVar91;
    auVar49._16_4_ = fVar93;
    auVar49._20_4_ = fVar96;
    auVar49._24_4_ = fVar98;
    auVar49._28_4_ = fStack_13c4;
    auVar58._16_8_ = uStack_1630;
    auVar58._0_16_ = auVar13;
    auVar58._24_8_ = uStack_1628;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar49,auVar58);
    auVar50._4_4_ = fVar86;
    auVar50._0_4_ = fVar83;
    auVar50._8_4_ = fVar88;
    auVar50._12_4_ = fVar91;
    auVar50._16_4_ = fVar93;
    auVar50._20_4_ = fVar96;
    auVar50._24_4_ = fVar98;
    auVar50._28_4_ = fStack_13c4;
    auVar60._16_8_ = uStack_16b0;
    auVar60._0_16_ = auVar11;
    auVar60._24_8_ = uStack_16a8;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar50,auVar60);
    auVar51._4_4_ = fVar85;
    auVar51._0_4_ = fVar82;
    auVar51._8_4_ = fVar87;
    auVar51._12_4_ = fVar90;
    auVar51._16_4_ = fVar92;
    auVar51._20_4_ = fVar95;
    auVar51._24_4_ = fVar97;
    auVar51._28_4_ = fStack_13c4;
    auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar51,ZEXT1632(auVar8));
    local_1460 = auVar79._0_4_;
    fStack_145c = auVar79._4_4_;
    fStack_1458 = auVar79._8_4_;
    fStack_1454 = auVar79._12_4_;
    auVar32._16_8_ = uStack_16f0;
    auVar32._0_16_ = auVar10;
    auVar32._24_8_ = uStack_16e8;
    auVar2 = vpand_avx2(auVar2,auVar32);
    local_1840 = auVar2._0_4_;
    fStack_183c = auVar2._4_4_;
    fStack_1838 = auVar2._8_4_;
    fStack_1834 = auVar2._12_4_;
    fStack_1830 = auVar2._16_4_;
    fStack_182c = auVar2._20_4_;
    fStack_1828 = auVar2._24_4_;
    fStack_1824 = auVar2._28_4_;
    auVar35._4_4_ = fStack_145c * fStack_13dc + fStack_183c;
    auVar35._0_4_ = local_1460 * local_13e0 + local_1840;
    auVar35._8_4_ = fStack_1458 * fStack_13d8 + fStack_1838;
    auVar35._12_4_ = fStack_1454 * fStack_13d4 + fStack_1834;
    auVar35._16_4_ = fStack_13d0 * 0.0 + fStack_1830;
    auVar35._20_4_ = fStack_13cc * 0.0 + fStack_182c;
    auVar35._24_4_ = fStack_13c8 * 0.0 + fStack_1828;
    auVar35._28_4_ = fStack_13c4 + fStack_1824;
    auVar2 = vpor_avx2(auVar35,auVar25);
    local_20c0 = auVar2._0_4_;
    fStack_20bc = auVar2._4_4_;
    fStack_20b8 = auVar2._8_4_;
    fStack_20b4 = auVar2._12_4_;
    fStack_20b0 = auVar2._16_4_;
    fStack_20ac = auVar2._20_4_;
    fStack_20a8 = auVar2._24_4_;
    fStack_20a4 = auVar2._28_4_;
    local_20e0 = auVar24._0_4_;
    fStack_20dc = auVar24._4_4_;
    fStack_20d8 = auVar24._8_4_;
    fStack_20d4 = auVar24._12_4_;
    fStack_20d0 = auVar24._16_4_;
    fStack_20cc = auVar24._20_4_;
    fStack_20c8 = auVar24._24_4_;
    fStack_20c4 = auVar24._28_4_;
    auVar29._16_8_ = uStack_1ff0;
    auVar29._0_16_ = auVar6;
    auVar29._24_8_ = uStack_1fe8;
    auVar2 = vpor_avx2(auVar22,auVar29);
    auVar22._16_8_ = uStack_2070;
    auVar22._0_16_ = auVar4;
    auVar22._24_8_ = uStack_2068;
    auVar2 = vcmpps_avx(auVar2,auVar22,1);
    auVar28._16_8_ = uStack_1fb0;
    auVar28._0_16_ = auVar7;
    auVar28._24_8_ = uStack_1fa8;
    auVar80 = vpor_avx2(auVar23,auVar28);
    auVar80 = vpand_avx2(auVar3,auVar80);
    auVar24._16_8_ = uStack_1ff0;
    auVar24._0_16_ = auVar6;
    auVar24._24_8_ = uStack_1fe8;
    auVar22 = vpand_avx2(auVar2,auVar24);
    auVar38._16_8_ = uStack_2070;
    auVar38._0_16_ = auVar4;
    auVar38._24_8_ = uStack_2068;
    auVar2 = vpandn_avx2(auVar2,auVar38);
    auVar2 = vpor_avx2(auVar22,auVar2);
    auVar2 = vpandn_avx2(auVar3,auVar2);
    auVar3 = vpor_avx2(auVar80,auVar2);
    auVar23._4_4_ = fStack_20bc + fStack_20dc;
    auVar23._0_4_ = local_20c0 + local_20e0;
    auVar23._12_4_ = fStack_20b4 + fStack_20d4;
    auVar23._8_4_ = fStack_20b8 + fStack_20d8;
    auVar23._20_4_ = fStack_20ac + fStack_20cc;
    auVar23._16_4_ = fStack_20b0 + fStack_20d0;
    auVar23._28_4_ = fStack_20a4 + fStack_20c4;
    auVar23._24_4_ = fStack_20a8 + fStack_20c8;
    auVar2 = vpand_avx2(auVar21,auVar23);
    auVar80 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
    auVar3 = vpand_avx2(auVar80,auVar3);
    auVar2 = vpor_avx2(auVar2,auVar3);
    local_2620 = auVar2._0_8_;
    uStackY_2618 = auVar2._8_8_;
    uStackY_2610 = auVar2._16_8_;
    uStackY_2608 = auVar2._24_8_;
    *(undefined8 *)*local_24e0 = local_2620;
    *(undefined8 *)(*local_24e0 + 8) = uStackY_2618;
    *(undefined8 *)(*local_24e0 + 0x10) = uStackY_2610;
    *(undefined8 *)(*local_24e0 + 0x18) = uStackY_2608;
    local_24d0 = local_24d0 + 1;
    local_24e0 = (undefined1 (*) [64])(*local_24e0 + 0x20);
  }
  uVar1 = *in_RSI;
  uVar84 = CONCAT44(uVar1,uVar1);
  uVar89 = CONCAT44(uVar1,uVar1);
  for (; local_24f4 + 3 < iVar78; local_24f4 = local_24f4 + 4) {
    auVar40._8_8_ = uVar89;
    auVar40._0_8_ = uVar84;
    auVar39._8_8_ = uVar89;
    auVar39._0_8_ = uVar84;
    auVar20._8_8_ = uVar89;
    auVar20._0_8_ = uVar84;
    auVar5._8_8_ = uVar89;
    auVar5._0_8_ = uVar84;
    auVar4 = vcmpps_avx(auVar5,ZEXT816(0),4);
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])*local_24d0,ZEXT816(0),4);
    auVar6 = vpand_avx(auVar4,auVar5);
    auVar8._8_8_ = 0x8000000080000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar7 = vpand_avx(auVar8,auVar20);
    auVar79._8_8_ = 0x8000000080000000;
    auVar79._0_8_ = 0x8000000080000000;
    auVar8 = vpand_avx(auVar79,*(undefined1 (*) [16])*local_24d0);
    auVar4 = vcmpps_avx(auVar39,ZEXT816(0),1);
    auVar79 = vcmpps_avx(*(undefined1 (*) [16])*local_24d0,ZEXT816(0),1);
    auVar9._8_8_ = 0x8000000080000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar79 = vpand_avx(auVar79,auVar9);
    auVar12._8_8_ = 0x40490fdb40490fdb;
    auVar12._0_8_ = 0x40490fdb40490fdb;
    auVar79 = vpor_avx(auVar79,auVar12);
    auVar9 = vpand_avx(auVar4,auVar79);
    auVar4 = vdivps_avx(*(undefined1 (*) [16])*local_24d0,auVar40);
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar10 = vpand_avx(auVar15,auVar4);
    auVar19._8_8_ = 0x8000000080000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar11 = vpandn_avx(auVar19,auVar4);
    auVar17._8_8_ = 0x3f8000003f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar4 = vcmpps_avx(auVar17,auVar11,1);
    auVar14._8_8_ = 0xbf800000bf800000;
    auVar14._0_8_ = 0xbf800000bf800000;
    auVar79 = vpand_avx(auVar4,auVar14);
    auVar12 = vpandn_avx(auVar4,auVar11);
    auVar12 = vpor_avx(auVar79,auVar12);
    auVar79 = vpand_avx(auVar4,auVar11);
    auVar18._8_8_ = 0x3f8000003f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar11 = vpandn_avx(auVar4,auVar18);
    auVar79 = vpor_avx(auVar79,auVar11);
    auVar79 = vdivps_avx(auVar12,auVar79);
    local_630 = auVar79._0_4_;
    fStack_62c = auVar79._4_4_;
    fStack_628 = auVar79._8_4_;
    fStack_624 = auVar79._12_4_;
    fVar82 = local_630 * local_630;
    fVar85 = fStack_62c * fStack_62c;
    fVar87 = fStack_628 * fStack_628;
    fVar90 = fStack_624 * fStack_624;
    fVar83 = fVar82 * fVar82;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar91 = fVar90 * fVar90;
    auVar61._4_4_ = fVar86;
    auVar61._0_4_ = fVar83;
    auVar61._8_4_ = fVar88;
    auVar61._12_4_ = fVar91;
    auVar70._8_8_ = 0xbc83a25cbc83a25c;
    auVar70._0_8_ = 0xbc83a25cbc83a25c;
    auVar72._8_8_ = 0xbd99b01ebd99b01e;
    auVar72._0_8_ = 0xbd99b01ebd99b01e;
    auVar79 = vfmadd213ps_fma(auVar70,auVar61,auVar72);
    auVar62._4_4_ = fVar86;
    auVar62._0_4_ = fVar83;
    auVar62._8_4_ = fVar88;
    auVar62._12_4_ = fVar91;
    auVar74._8_8_ = 0xbe117200be117200;
    auVar74._0_8_ = 0xbe117200be117200;
    auVar79 = vfmadd213ps_fma(auVar79,auVar62,auVar74);
    auVar63._4_4_ = fVar86;
    auVar63._0_4_ = fVar83;
    auVar63._8_4_ = fVar88;
    auVar63._12_4_ = fVar91;
    auVar76._8_8_ = 0xbeaaaa53beaaaa53;
    auVar76._0_8_ = 0xbeaaaa53beaaaa53;
    auVar79 = vfmadd213ps_fma(auVar79,auVar63,auVar76);
    auVar64._4_4_ = fVar86;
    auVar64._0_4_ = fVar83;
    auVar64._8_4_ = fVar88;
    auVar64._12_4_ = fVar91;
    auVar69._8_8_ = 0x3b3ac5373b3ac537;
    auVar69._0_8_ = 0x3b3ac5373b3ac537;
    auVar71._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar71._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar11 = vfmadd213ps_fma(auVar69,auVar64,auVar71);
    auVar65._4_4_ = fVar86;
    auVar65._0_4_ = fVar83;
    auVar65._8_4_ = fVar88;
    auVar65._12_4_ = fVar91;
    auVar73._8_8_ = 0x3dd9ed243dd9ed24;
    auVar73._0_8_ = 0x3dd9ed243dd9ed24;
    auVar11 = vfmadd213ps_fma(auVar11,auVar65,auVar73);
    auVar66._4_4_ = fVar86;
    auVar66._0_4_ = fVar83;
    auVar66._8_4_ = fVar88;
    auVar66._12_4_ = fVar91;
    auVar75._8_8_ = 0x3e4cb9743e4cb974;
    auVar75._0_8_ = 0x3e4cb9743e4cb974;
    auVar11 = vfmadd213ps_fma(auVar11,auVar66,auVar75);
    auVar67._4_4_ = fVar86;
    auVar67._0_4_ = fVar83;
    auVar67._8_4_ = fVar88;
    auVar67._12_4_ = fVar91;
    auVar77._8_8_ = 0x3f8000003f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar11 = vfmadd213ps_fma(auVar11,auVar67,auVar77);
    auVar68._4_4_ = fVar85;
    auVar68._0_4_ = fVar82;
    auVar68._8_4_ = fVar87;
    auVar68._12_4_ = fVar90;
    auVar79 = vfmadd213ps_fma(auVar79,auVar68,auVar11);
    local_670 = auVar79._0_4_;
    fStack_66c = auVar79._4_4_;
    fStack_668 = auVar79._8_4_;
    fStack_664 = auVar79._12_4_;
    auVar13._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar13._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar4 = vpand_avx(auVar4,auVar13);
    local_6a0 = auVar4._0_4_;
    fStack_69c = auVar4._4_4_;
    fStack_698 = auVar4._8_4_;
    fStack_694 = auVar4._12_4_;
    auVar16._4_4_ = fStack_66c * fStack_62c + fStack_69c;
    auVar16._0_4_ = local_670 * local_630 + local_6a0;
    auVar16._8_4_ = fStack_668 * fStack_628 + fStack_698;
    auVar16._12_4_ = fStack_664 * fStack_624 + fStack_694;
    auVar4 = vpor_avx(auVar16,auVar10);
    local_b80 = auVar4._0_4_;
    fStack_b7c = auVar4._4_4_;
    fStack_b78 = auVar4._8_4_;
    fStack_b74 = auVar4._12_4_;
    local_b90 = auVar9._0_4_;
    fStack_b8c = auVar9._4_4_;
    fStack_b88 = auVar9._8_4_;
    fStack_b84 = auVar9._12_4_;
    auVar11._8_8_ = 0x40490fdb40490fdb;
    auVar11._0_8_ = 0x40490fdb40490fdb;
    auVar4 = vpor_avx(auVar7,auVar11);
    auVar4 = vcmpps_avx(auVar4,ZEXT816(0),1);
    auVar10._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar10._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar79 = vpor_avx(auVar8,auVar10);
    auVar79 = vpand_avx(auVar5,auVar79);
    auVar7._8_8_ = 0x40490fdb40490fdb;
    auVar7._0_8_ = 0x40490fdb40490fdb;
    auVar7 = vpand_avx(auVar4,auVar7);
    auVar4 = vpandn_avx(auVar4,ZEXT816(0));
    auVar4 = vpor_avx(auVar7,auVar4);
    auVar4 = vpandn_avx(auVar5,auVar4);
    auVar5 = vpor_avx(auVar79,auVar4);
    auVar4._4_4_ = fStack_b7c + fStack_b8c;
    auVar4._0_4_ = local_b80 + local_b90;
    auVar4._12_4_ = fStack_b74 + fStack_b84;
    auVar4._8_4_ = fStack_b78 + fStack_b88;
    auVar4 = vpand_avx(auVar6,auVar4);
    auVar79 = vpternlogq_avx512vl(auVar6,auVar6,auVar6,0xf);
    auVar5 = vpand_avx(auVar79,auVar5);
    auVar4 = vpor_avx(auVar4,auVar5);
    local_2650 = auVar4._0_8_;
    uStackY_2648 = auVar4._8_8_;
    *(undefined8 *)*local_24e0 = local_2650;
    *(undefined8 *)(*local_24e0 + 8) = uStackY_2648;
    local_24d0 = (undefined1 (*) [32])(*local_24d0 + 0x10);
    local_24e0 = (undefined1 (*) [64])(*local_24e0 + 0x10);
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}